

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::wakeup(EventLoop *this)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  LogStream *pLVar4;
  self *psVar5;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  undefined1 local_2fd0 [12];
  Logger local_2fc0;
  undefined1 local_1ff0 [12];
  Logger local_1fe0;
  undefined1 local_1000 [12];
  Logger local_ff0;
  int local_1c;
  undefined8 uStack_18;
  int n;
  uint64_t one;
  EventLoop *this_local;
  
  uStack_18 = 1;
  local_1c = 0;
  one = (uint64_t)this;
  sVar3 = write(this->m_wakeupFd,&stack0xffffffffffffffe8,8);
  local_1c = (int)sVar3;
  if (local_1c < 1) {
    if (local_1c == 0) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1ff0,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_1ff0._0_8_;
      file_00.m_size = local_1ff0._8_4_;
      Logger::Logger(&local_1fe0,file_00,0xff,ERROR);
      pLVar4 = Logger::stream(&local_1fe0);
      LogStream::operator<<(pLVar4,"EventLoop::wakeup() send return equal zero");
      Logger::~Logger(&local_1fe0);
    }
    else {
      iVar2 = sz_getlasterr();
      if ((iVar2 != 4) && (bVar1 = sockets::sz_wouldblock(), !bVar1)) {
        Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_2fd0,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                  );
        file_01._12_4_ = 0;
        file_01.m_data = (char *)local_2fd0._0_8_;
        file_01.m_size = local_2fd0._8_4_;
        Logger::Logger(&local_2fc0,file_01,0x10a,ERROR);
        pLVar4 = Logger::stream(&local_2fc0);
        psVar5 = LogStream::operator<<(pLVar4,"EventLoop::wakeup() send error ");
        iVar2 = sz_getlasterr();
        LogStream::operator<<(psVar5,iVar2);
        Logger::~Logger(&local_2fc0);
      }
    }
  }
  else if (local_1c != 8) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1000,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1000._0_8_;
    file.m_size = local_1000._8_4_;
    Logger::Logger(&local_ff0,file,0xf9,ERROR);
    pLVar4 = Logger::stream(&local_ff0);
    psVar5 = LogStream::operator<<(pLVar4,"EventLoop::wakeup() writes ");
    pLVar4 = LogStream::operator<<(psVar5,local_1c);
    LogStream::operator<<(pLVar4," bytes instead of 8");
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void EventLoop::wakeup()
{
	uint64_t one = 1;
	int n = 0;
#if defined(SZ_OS_WINDOWS)
	n = ::send(m_wakeupFd.event_write, reinterpret_cast<const char*>(&one), sizeof(one), 0);
#else
	n = ::write(m_wakeupFd, &one, sizeof(one));
#endif
	if (n > 0) 
	{
		if (n != sizeof(one))
		{
			LOG_ERROR << "EventLoop::wakeup() writes " << n << " bytes instead of 8";
		}
		return;
	}
	else if (n == 0) 
	{
		LOG_ERROR << "EventLoop::wakeup() send return equal zero";
	}
	else 
	{
		if (sz_getlasterr() == sz_err_eintr || sockets::sz_wouldblock())
		{
			//LOG_WARN << "EventLoop::wakeup() send sz_getlasterr() rst " 
			//	<< sz_getlasterr() 
			//	<< " is sz_err_eintr or sockets::sz_wouldblock()";
			return;
		}
		LOG_ERROR << "EventLoop::wakeup() send error " << sz_getlasterr();
	}
}